

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
 __thiscall
duckdb::ZSTDStorage::StringInitSegment
          (ZSTDStorage *this,ColumnSegment *segment,block_id_t block_id,
          optional_ptr<duckdb::ColumnSegmentState,_true> segment_state)

{
  pointer plVar1;
  pointer plVar2;
  optional_ptr<duckdb::ColumnSegmentState,_true> oVar3;
  UncompressedStringSegmentState *pUVar4;
  pointer pUVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::UncompressedStringSegmentState_*,_false> local_28;
  optional_ptr<duckdb::ColumnSegmentState,_true> local_20;
  
  local_20.ptr = segment_state.ptr;
  pUVar4 = (UncompressedStringSegmentState *)operator_new(0xd0);
  switchD_01043a80::default(&(pUVar4->overflow_blocks)._M_h._M_rehash_policy,0,0x90);
  (pUVar4->super_CompressedSegmentState)._vptr_CompressedSegmentState =
       (_func_int **)&PTR__UncompressedStringSegmentState_02444a38;
  (pUVar4->head).super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
  _M_t.super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
  super__Head_base<0UL,_duckdb::StringBlock_*,_false> =
       (_Head_base<0UL,_duckdb::StringBlock_*,_false>)0x0;
  (pUVar4->overflow_blocks)._M_h._M_buckets = &(pUVar4->overflow_blocks)._M_h._M_single_bucket;
  (pUVar4->overflow_blocks)._M_h._M_bucket_count = 1;
  (pUVar4->overflow_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pUVar4->overflow_blocks)._M_h._M_element_count = 0;
  (pUVar4->overflow_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pUVar4->overflow_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (pUVar4->overflow_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pUVar4->overflow_writer).
  super_unique_ptr<duckdb::OverflowStringWriter,_std::default_delete<duckdb::OverflowStringWriter>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::OverflowStringWriter,_std::default_delete<duckdb::OverflowStringWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::OverflowStringWriter_*,_std::default_delete<duckdb::OverflowStringWriter>_>
  .super__Head_base<0UL,_duckdb::OverflowStringWriter_*,_false> =
       (_Head_base<0UL,_duckdb::OverflowStringWriter_*,_false>)0x0;
  (pUVar4->block_manager).ptr = (BlockManager *)0x0;
  (pUVar4->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pUVar4->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (pUVar4->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (pUVar4->block_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pUVar4->block_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pUVar4->block_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (pUVar4->block_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pUVar4->block_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (pUVar4->handles)._M_h._M_buckets = &(pUVar4->handles)._M_h._M_single_bucket;
  (pUVar4->handles)._M_h._M_bucket_count = 1;
  (pUVar4->handles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pUVar4->handles)._M_h._M_element_count = 0;
  (pUVar4->handles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pUVar4->handles)._M_h._M_rehash_policy._M_next_resize = 0;
  (pUVar4->handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_28._M_head_impl = pUVar4;
  if (segment_state.ptr != (ColumnSegmentState *)0x0) {
    optional_ptr<duckdb::ColumnSegmentState,_true>::CheckValid(&local_20);
    oVar3.ptr = local_20.ptr;
    pUVar5 = unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
             ::operator->((unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
                           *)&local_28);
    plVar1 = (pUVar5->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
    plVar2 = ((oVar3.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    (pUVar5->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         ((oVar3.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    (pUVar5->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         plVar2;
    (pUVar5->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         ((oVar3.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    ((oVar3.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((oVar3.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ((oVar3.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (plVar1 != (pointer)0x0) {
      operator_delete(plVar1);
    }
  }
  *(UncompressedStringSegmentState **)this = local_28._M_head_impl;
  return (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
          )(unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
            )this;
}

Assistant:

unique_ptr<CompressedSegmentState> ZSTDStorage::StringInitSegment(ColumnSegment &segment, block_id_t block_id,
                                                                  optional_ptr<ColumnSegmentState> segment_state) {
	auto result = make_uniq<UncompressedStringSegmentState>();
	if (segment_state) {
		auto &serialized_state = segment_state->Cast<SerializedStringSegmentState>();
		result->on_disk_blocks = std::move(serialized_state.blocks);
	}
	return std::move(result);
}